

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::logMessage
          (CommonCore *this,LocalFederateId federateID,int logLevel,string_view messageToLog)

{
  BaseType BVar1;
  FederateState *pFVar2;
  atomic<helics::GlobalBrokerId> *paVar3;
  InvalidIdentifier *this_00;
  string_view message;
  string_view messageToLog_local;
  ActionMessage log;
  
  messageToLog_local._M_str = messageToLog._M_str;
  messageToLog_local._M_len = messageToLog._M_len;
  if (federateID.fid == -0x103) {
    paVar3 = &(this->super_BrokerBase).global_id;
  }
  else {
    pFVar2 = getFederateAt(this,federateID);
    if (pFVar2 == (FederateState *)0x0) {
      this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
      message._M_str = "FederateID is not valid (logMessage)";
      message._M_len = 0x24;
      InvalidIdentifier::InvalidIdentifier(this_00,message);
      __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
    }
    paVar3 = (atomic<helics::GlobalBrokerId> *)&pFVar2->global_id;
  }
  BVar1 = (((atomic<helics::GlobalFederateId> *)paVar3)->_M_i).gid;
  ActionMessage::ActionMessage(&log,cmd_log);
  log.messageID = logLevel;
  log.source_id.gid = BVar1;
  log.dest_id.gid = BVar1;
  SmallBuffer::operator=
            (&log.payload,(basic_string_view<char,_std::char_traits<char>_> *)&messageToLog_local);
  gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>
  ::push<helics::ActionMessage&>
            ((BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
             &(this->super_BrokerBase).actionQueue,&log);
  ActionMessage::~ActionMessage(&log);
  return;
}

Assistant:

void CommonCore::logMessage(LocalFederateId federateID, int logLevel, std::string_view messageToLog)
{
    GlobalFederateId gid;
    if (federateID == gLocalCoreId) {
        gid = global_id.load();
    } else {
        auto* fed = getFederateAt(federateID);
        if (fed == nullptr) {
            throw(InvalidIdentifier("FederateID is not valid (logMessage)"));
        }
        gid = fed->global_id;
    }
    ActionMessage log(CMD_LOG);
    log.source_id = gid;
    log.dest_id = gid;
    log.messageID = logLevel;
    log.payload = messageToLog;
    actionQueue.push(log);
}